

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-brdf.cpp
# Opt level: O0

bool loadSphereDataBuffers(float dt)

{
  GLenum GVar1;
  float fovy;
  mat4 local_30c;
  mat4 local_2cc;
  mat4 local_28c;
  undefined1 local_24c [8];
  mat4 view;
  mat4 local_1cc;
  undefined1 local_18c [8];
  mat4 viewInv;
  mat4 projection;
  Transform transform;
  float dt_local;
  
  transform.viewInv.m[3].z = dt;
  loadSphereDataBuffers::Transform::Transform((Transform *)&projection.m[3].z);
  if ((loadSphereDataBuffers::first & 1U) != 0) {
    g_gl.streams[1] = djgb_create(0x100);
    loadSphereDataBuffers::first = false;
  }
  fovy = radians(g_camera.fovy);
  dja::mat4::homogeneous::perspective
            ((mat4 *)&viewInv.m[3].z,fovy,(float)g_framebuffer.w / (float)g_framebuffer.h,
             g_camera.zNear,g_camera.zFar);
  dja::mat4::homogeneous::translation(&local_1cc,&g_camera.pos);
  dja::mat4::homogeneous::from_mat3((mat4 *)&view.m[3].z,&g_camera.axis);
  dja::operator*((mat4 *)local_18c,&local_1cc,(mat4 *)&view.m[3].z);
  dja::inverse((mat4 *)local_24c,(mat4 *)local_18c);
  memcpy(&transform.modelView.m[3].z,&viewInv.m[3].z,0x40);
  dja::mat4::mat4(&local_2cc,1.0);
  dja::operator*(&local_28c,(mat4 *)local_24c,&local_2cc);
  memcpy(&projection.m[3].z,&local_28c,0x40);
  dja::operator*(&local_30c,(mat4 *)&transform.modelView.m[3].z,(mat4 *)&projection.m[3].z);
  memcpy(&transform.projection.m[3].z,&local_30c,0x40);
  memcpy(&transform.modelViewProjection.m[3].z,local_18c,0x40);
  djgb_to_gl(g_gl.streams[1],&projection.m[3].z,(int *)0x0);
  djgb_glbindrange(g_gl.streams[1],0x8a11,1);
  GVar1 = (*glad_glGetError)();
  return GVar1 == 0;
}

Assistant:

bool loadSphereDataBuffers(float dt = 0)
{
    static bool first = true;
    struct Transform {
        dja::mat4 modelView, projection, modelViewProjection, viewInv;
    } transform;

    if (first) {
        g_gl.streams[STREAM_TRANSFORM] = djgb_create(sizeof(transform));
        first = false;
    }

    // extract view and projection matrices
    dja::mat4 projection = dja::mat4::homogeneous::perspective(
        radians(g_camera.fovy),
        (float)g_framebuffer.w / (float)g_framebuffer.h,
        g_camera.zNear,
        g_camera.zFar
    );
    dja::mat4 viewInv = dja::mat4::homogeneous::translation(g_camera.pos)
                      * dja::mat4::homogeneous::from_mat3(g_camera.axis);
    dja::mat4 view = dja::inverse(viewInv);


    // upload transformations
    transform.projection = projection;
    transform.modelView  = view * dja::mat4(1);
    transform.modelViewProjection = transform.projection * transform.modelView;
    transform.viewInv = viewInv;

    // upload planet data
    djgb_to_gl(g_gl.streams[STREAM_TRANSFORM], (const void *)&transform, NULL);
    djgb_glbindrange(g_gl.streams[STREAM_TRANSFORM],
                     GL_UNIFORM_BUFFER,
                     STREAM_TRANSFORM);

    return (glGetError() == GL_NO_ERROR);
}